

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O1

void al_color_xyz_to_rgb(float x,float y,float z,float *red,float *green,float *blue)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = (double)x;
  dVar2 = (double)y;
  dVar4 = (double)z;
  dVar1 = dVar4 * -0.4986 + dVar5 * 3.2406 + dVar2 * -1.5372;
  dVar3 = dVar4 * 0.0415 + dVar5 * -0.9689 + dVar2 * 1.8758;
  if (0.0031308 <= dVar1) {
    dVar1 = pow(dVar1,0.4166666666666667);
    dVar1 = dVar1 * 1.055 + -0.055;
  }
  else {
    dVar1 = dVar1 * 12.92;
  }
  dVar2 = dVar4 * 1.057 + dVar5 * 0.0557 + dVar2 * -0.204;
  *red = (float)dVar1;
  if (0.0031308 <= dVar3) {
    dVar1 = pow(dVar3,0.4166666666666667);
    dVar3 = dVar1 * 1.055 + -0.055;
  }
  else {
    dVar3 = dVar3 * 12.92;
  }
  *green = (float)dVar3;
  if (0.0031308 <= dVar2) {
    dVar1 = pow(dVar2,0.4166666666666667);
    dVar2 = dVar1 * 1.055 + -0.055;
  }
  else {
    dVar2 = dVar2 * 12.92;
  }
  *blue = (float)dVar2;
  return;
}

Assistant:

void al_color_xyz_to_rgb(float x, float y, float z,
    float *red, float *green, float *blue)
{
   double r = 3.2406 * x + (-1.5372 * y) + (-0.4986 * z);
   double g = -0.9689 * x + 1.8758 * y + 0.0415 * z;
   double b = 0.0557 * x + (-0.2040 * y) + 1.0570 * z;
   *red = srgba_linear_to_gamma(r);
   *green = srgba_linear_to_gamma(g);
   *blue = srgba_linear_to_gamma(b);
}